

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

void __thiscall avilib::AviWriter::~AviWriter(AviWriter *this)

{
  int in_ESI;
  AviWriter *this_local;
  
  this->_vptr_AviWriter = (_func_int **)&PTR__AviWriter_001d1d38;
  close(this,in_ESI);
  std::
  map<int,_avilib::_avistreamheader,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avistreamheader>_>_>
  ::~map(&this->m_avisHeaders);
  std::deque<avilib::_avioldindex,_std::allocator<avilib::_avioldindex>_>::~deque
            (&this->m_oldIndexEntries);
  std::
  map<int,_avilib_streamtype_t,_std::less<int>,_std::allocator<std::pair<const_int,_avilib_streamtype_t>_>_>
  ::~map(&this->m_streamTypes);
  std::
  map<int,_std::map<int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<avilib::_avistdindex_entry,_std::allocator<avilib::_avistdindex_entry>_>_>_>_>_>_>_>
  ::~map(&this->m_stdIndexEntries);
  std::
  map<int,_std::vector<avilib::_avistdindex_chunk,_std::allocator<avilib::_avistdindex_chunk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<avilib::_avistdindex_chunk,_std::allocator<avilib::_avistdindex_chunk>_>_>_>_>
  ::~map(&this->m_stdIndexes);
  std::
  map<int,_avilib::_avisuperindex_chunk,_std::less<int>,_std::allocator<std::pair<const_int,_avilib::_avisuperindex_chunk>_>_>
  ::~map(&this->m_superIdxs);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::~map
            (&this->pos_streamHeader);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::~map
            (&this->pos_odmlSuperIdx);
  std::ofstream::~ofstream(&this->_f);
  LoggingObject::~LoggingObject(&this->super_LoggingObject);
  return;
}

Assistant:

avilib::AviWriter::~AviWriter()
{
	close();
}